

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdCreatePsbtHandle(void *handle,int net_type,char *psbt_string,char *tx_hex_string,
                       uint32_t version,uint32_t locktime,void **psbt_handle)

{
  bool bVar1;
  NetType NVar2;
  void *pvVar3;
  Psbt *this;
  CfdException *pCVar4;
  string *this_00;
  bool is_bitcoin;
  void *local_1b0;
  string local_1a8;
  allocator local_188 [24];
  string err_msg;
  Psbt local_130;
  Psbt psbt;
  
  local_1b0 = handle;
  cfd::Initialize();
  if (psbt_handle == (void **)0x0) {
    psbt.super_Psbt._vptr_Psbt = (_func_int **)0x4fd756;
    psbt.super_Psbt.wally_psbt_pointer_._0_4_ = 0x110;
    psbt.super_Psbt.base_tx_.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)anon_var_dwarf_7c7b9c;
    cfd::core::logger::warn<>((CfdSourceLocation *)&psbt,"psbt_handle is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&psbt,"Failed to parameter. psbt_handle is null.",(allocator *)&local_130);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&psbt);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  is_bitcoin = false;
  NVar2 = cfd::capi::ConvertNetType(net_type,&is_bitcoin);
  if (is_bitcoin == false) {
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&psbt,"Elements is not supported.",(allocator *)&local_130);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&psbt);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::Psbt::Psbt(&psbt);
  bVar1 = cfd::capi::IsEmptyString(psbt_string);
  if (bVar1) {
    bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
    if (bVar1) {
      cfd::Psbt::Psbt(&local_130,version,locktime);
      cfd::Psbt::operator=(&psbt,&local_130);
      cfd::Psbt::~Psbt(&local_130);
      goto LAB_003814f6;
    }
    std::__cxx11::string::string((string *)&local_1a8,tx_hex_string,local_188);
    cfd::core::Transaction::Transaction((Transaction *)&err_msg,&local_1a8);
    cfd::Psbt::Psbt(&local_130,(Transaction *)&err_msg);
    cfd::Psbt::operator=(&psbt,&local_130);
    cfd::Psbt::~Psbt(&local_130);
    cfd::core::Transaction::~Transaction((Transaction *)&err_msg);
    this_00 = &local_1a8;
  }
  else {
    std::__cxx11::string::string((string *)&err_msg,psbt_string,(allocator *)&local_1a8);
    cfd::Psbt::Psbt(&local_130,&err_msg);
    cfd::Psbt::operator=(&psbt,&local_130);
    cfd::Psbt::~Psbt(&local_130);
    this_00 = &err_msg;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_003814f6:
  std::__cxx11::string::string((string *)&local_130,"PsbtHandle",(allocator *)&err_msg);
  pvVar3 = cfd::capi::AllocBuffer((string *)&local_130,0x20);
  std::__cxx11::string::~string((string *)&local_130);
  this = (Psbt *)operator_new(0x80);
  cfd::Psbt::Psbt(this,&psbt);
  *(Psbt **)((long)pvVar3 + 0x18) = this;
  *(NetType *)((long)pvVar3 + 0x10) = NVar2;
  *psbt_handle = pvVar3;
  cfd::Psbt::~Psbt(&psbt);
  return 0;
}

Assistant:

int CfdCreatePsbtHandle(
    void* handle, int net_type, const char* psbt_string,
    const char* tx_hex_string, uint32_t version, uint32_t locktime,
    void** psbt_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiPsbtHandle* buffer = nullptr;
  try {
    cfd::Initialize();

    if (psbt_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt_handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. psbt_handle is null.");
    }
    bool is_bitcoin = false;
    NetType network_type = ConvertNetType(net_type, &is_bitcoin);
    if (!is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
    }

    Psbt psbt;
    if (!IsEmptyString(psbt_string)) {
      try {
        psbt = Psbt(psbt_string);
      } catch (const CfdException& fail_base64) {
        std::string err_msg(fail_base64.what());
        if (err_msg != "psbt unmatch magic error.") {
          throw fail_base64;
        }
        psbt = Psbt(ByteData(psbt_string));
      }
    } else if (!IsEmptyString(tx_hex_string)) {
      psbt = Psbt(Transaction(tx_hex_string));
    } else {
      psbt = Psbt(version, locktime);
    }

    buffer = static_cast<CfdCapiPsbtHandle*>(
        AllocBuffer(kPrefixPsbtHandle, sizeof(CfdCapiPsbtHandle)));
    buffer->psbt = new Psbt(psbt);
    buffer->net_type = network_type;
    *psbt_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  CfdFreePsbtHandle(handle, buffer);
  return result;
}